

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void malloc_conf_error(char *msg,char *k,size_t klen,char *v,size_t vlen)

{
  int iVar1;
  size_t __n;
  undefined8 in_RCX;
  ulong in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  ulong in_R8;
  char *experimental;
  
  malloc_printf("<jemalloc>: %s: %.*s:%.*s\n",in_RDI,in_RDX & 0xffffffff,in_RSI,in_R8 & 0xffffffff,
                in_RCX);
  __n = strlen("experimental_");
  iVar1 = strncmp(in_RSI,"experimental_",__n);
  if (iVar1 != 0) {
    had_conf_error = true;
  }
  return;
}

Assistant:

static void
malloc_conf_error(const char *msg, const char *k, size_t klen, const char *v,
    size_t vlen) {
	malloc_printf("<jemalloc>: %s: %.*s:%.*s\n", msg, (int)klen, k,
	    (int)vlen, v);
	/* If abort_conf is set, error out after processing all options. */
	const char *experimental = "experimental_";
	if (strncmp(k, experimental, strlen(experimental)) == 0) {
		/* However, tolerate experimental features. */
		return;
	}
	had_conf_error = true;
}